

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_initDStream(ZSTD_DStream *zds)

{
  size_t sVar1;
  
  zds->streamStage = zdss_init;
  zds->noForwardProgress = 0;
  sVar1 = ZSTD_DCtx_refDDict(zds,(ZSTD_DDict *)0x0);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = ZSTD_startingInputLength(zds->format);
    return sVar1;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initDStream(ZSTD_DStream* zds)
{
    DEBUGLOG(4, "ZSTD_initDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(zds, ZSTD_reset_session_only), "");
    FORWARD_IF_ERROR(ZSTD_DCtx_refDDict(zds, NULL), "");
    return ZSTD_startingInputLength(zds->format);
}